

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_base.hpp
# Opt level: O0

size_t jessilib::encode_codepoint_utf8<char8_t,char8_t*>
                 (char8_t **out_destination,char32_t in_codepoint)

{
  byte in_value;
  char32_t in_codepoint_local;
  char8_t **out_destination_local;
  
  if ((uint)in_codepoint < 0x110000) {
    in_value = (byte)in_codepoint;
    if ((uint)in_codepoint < 0x80) {
      impl_unicode::append_helper<char8_t>(out_destination,in_value);
      out_destination_local = (char8_t **)0x1;
    }
    else if ((uint)in_codepoint < 0x800) {
      impl_unicode::append_helper<char8_t>
                (out_destination,(byte)((uint)in_codepoint >> 6) & 0x1f | 0xc0);
      impl_unicode::append_helper<char8_t>(out_destination,in_value & 0x3f | 0x80);
      out_destination_local = (char8_t **)0x2;
    }
    else if ((uint)in_codepoint < 0x10000) {
      impl_unicode::append_helper<char8_t>
                (out_destination,(byte)((uint)in_codepoint >> 0xc) & 0xf | 0xe0);
      impl_unicode::append_helper<char8_t>
                (out_destination,(byte)((uint)in_codepoint >> 6) & 0x3f | 0x80);
      impl_unicode::append_helper<char8_t>(out_destination,in_value & 0x3f | 0x80);
      out_destination_local = (char8_t **)0x3;
    }
    else {
      impl_unicode::append_helper<char8_t>
                (out_destination,(byte)((uint)in_codepoint >> 0x12) & 7 | 0xf0);
      impl_unicode::append_helper<char8_t>
                (out_destination,(byte)((uint)in_codepoint >> 0xc) & 0x3f | 0x80);
      impl_unicode::append_helper<char8_t>
                (out_destination,(byte)((uint)in_codepoint >> 6) & 0x3f | 0x80);
      impl_unicode::append_helper<char8_t>(out_destination,in_value & 0x3f | 0x80);
      out_destination_local = (char8_t **)0x4;
    }
  }
  else {
    out_destination_local = (char8_t **)0x0;
  }
  return (size_t)out_destination_local;
}

Assistant:

constexpr size_t encode_codepoint_utf8(T& out_destination, char32_t in_codepoint) {
	if (in_codepoint > 0x10FFFF) {
		return 0;
	}

	if (in_codepoint <= 0x007F) {
		// 1-byte sequence (7 bits)
		impl_unicode::append_helper(out_destination, static_cast<CharT>(in_codepoint));
		return 1;
	}

	if (in_codepoint <= 0x07FF) {
		// 2-byte sequence (11 bits; 5 + 6)
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0xC0 | ((in_codepoint >> 6) & 0x1F)));
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | (in_codepoint & 0x3F)));
		return 2;
	}

	if (in_codepoint <= 0xFFFF) {
		// 3-byte sequence (16 bits; 4 + 6 + 6)
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0xE0 | ((in_codepoint >> 12) & 0x0F)));
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | ((in_codepoint >> 6) & 0x3F)));
		impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | (in_codepoint & 0x3F)));
		return 3;
	}

	// 4-byte sequence (21 bits; 3 + 6 + 6 + 6)
	impl_unicode::append_helper(out_destination, static_cast<CharT>(0xF0 | ((in_codepoint >> 18) & 0x07)));
	impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | ((in_codepoint >> 12) & 0x3F)));
	impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | ((in_codepoint >> 6) & 0x3F)));
	impl_unicode::append_helper(out_destination, static_cast<CharT>(0x80 | (in_codepoint & 0x3F)));
	return 4;
}